

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  cmMakefile *pcVar1;
  size_type sVar2;
  cmTarget *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  char *pcVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  LinkClosure *pLVar13;
  byte bVar14;
  pointer pbVar15;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar16;
  allocator local_114;
  allocator local_113;
  allocator local_112;
  allocator local_111;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_110;
  string rootPath;
  string suffix;
  string d;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string local_70;
  string local_50;
  
  pcVar1 = this->Makefile;
  local_110 = runtimeDirs;
  std::__cxx11::string::string((string *)&emitted,"CMAKE_SKIP_RPATH",(allocator *)&rootPath);
  bVar4 = cmMakefile::IsOn(pcVar1,(string *)&emitted);
  sVar2 = (this->RuntimeFlag)._M_string_length;
  std::__cxx11::string::~string((string *)&emitted);
  bVar5 = true;
  if (!for_install) {
    pcVar3 = this->Target;
    std::__cxx11::string::string
              ((string *)&emitted,"BUILD_WITH_INSTALL_RPATH",(allocator *)&rootPath);
    bVar5 = cmTarget::GetPropertyAsBool(pcVar3,(string *)&emitted);
    std::__cxx11::string::~string((string *)&emitted);
  }
  if (bVar4 || sVar2 == 0) {
    bVar7 = 0;
  }
  else {
    bVar4 = cmTarget::HaveInstallTreeRPATH(this->Target);
    bVar6 = cmTarget::HaveBuildTreeRPATH(this->Target,&this->Config);
    bVar7 = bVar6 & (bVar5 ^ 1U);
    if ((bVar5 ^ 1U) == 0) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string((string *)&emitted,"CMAKE_SKIP_INSTALL_RPATH",(allocator *)&d);
      bVar6 = cmMakefile::IsOn(pcVar1,(string *)&emitted);
      if (bVar6) {
        bVar6 = false;
      }
      else {
        pcVar3 = this->Target;
        std::__cxx11::string::string
                  ((string *)&rootPath,"INSTALL_RPATH_USE_LINK_PATH",(allocator *)&suffix);
        bVar6 = cmTarget::GetPropertyAsBool(pcVar3,&rootPath);
        std::__cxx11::string::~string((string *)&rootPath);
      }
      bVar14 = bVar5 & bVar4;
      std::__cxx11::string::~string((string *)&emitted);
      goto LAB_0034abd5;
    }
  }
  bVar14 = 0;
  bVar6 = false;
LAB_0034abd5:
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (bVar14 != 0) {
    pcVar3 = this->Target;
    std::__cxx11::string::string((string *)&rootPath,"INSTALL_RPATH",(allocator *)&d);
    pcVar8 = cmTarget::GetProperty(pcVar3,&rootPath);
    std::__cxx11::string::~string((string *)&rootPath);
    cmCLI_ExpandListUnique(pcVar8,local_110,&emitted);
  }
  if ((bVar7 | bVar6) == 1) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&d,"CMAKE_SYSROOT",(allocator *)&suffix);
    pcVar8 = cmMakefile::GetSafeDefinition(pcVar1,&d);
    std::__cxx11::string::string((string *)&rootPath,pcVar8,(allocator *)&local_70);
    std::__cxx11::string::~string((string *)&d);
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&d,"CMAKE_STAGING_PREFIX",(allocator *)&suffix);
    pcVar8 = cmMakefile::GetDefinition(pcVar1,&d);
    std::__cxx11::string::~string((string *)&d);
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&d,"CMAKE_INSTALL_PREFIX",(allocator *)&suffix);
    cmMakefile::GetSafeDefinition(pcVar1,&d);
    std::__cxx11::string::~string((string *)&d);
    cmsys::SystemTools::ConvertToUnixSlashes(&rootPath);
    pvVar9 = GetRuntimeSearchPath_abi_cxx11_(this);
    for (pbVar15 = (pvVar9->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        pbVar15 !=
        (pvVar9->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish; pbVar15 = pbVar15 + 1) {
      if (bVar7 == 0) {
        if (bVar6 != false) {
          pcVar11 = cmMakefile::GetHomeDirectory(this->Makefile);
          pcVar12 = cmMakefile::GetHomeOutputDirectory(this->Makefile);
          std::__cxx11::string::string((string *)&d,pcVar11,&local_111);
          bVar4 = cmsys::SystemTools::ComparePath(pbVar15,&d);
          if (!bVar4) {
            std::__cxx11::string::string((string *)&suffix,pcVar12,&local_112);
            bVar4 = cmsys::SystemTools::ComparePath(pbVar15,&suffix);
            if (!bVar4) {
              std::__cxx11::string::string((string *)&local_70,pcVar11,&local_113);
              bVar4 = cmsys::SystemTools::IsSubDirectory(pbVar15,&local_70);
              if (!bVar4) {
                std::__cxx11::string::string((string *)&local_50,pcVar12,&local_114);
                bVar4 = cmsys::SystemTools::IsSubDirectory(pbVar15,&local_50);
                std::__cxx11::string::~string((string *)&local_50);
                std::__cxx11::string::~string((string *)&local_70);
                std::__cxx11::string::~string((string *)&suffix);
                std::__cxx11::string::~string((string *)&d);
                if (bVar4) goto LAB_0034af1a;
                std::__cxx11::string::string((string *)&d,(string *)pbVar15);
                if (rootPath._M_string_length == 0) {
LAB_0034af9f:
                  if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
                    lVar10 = std::__cxx11::string::find((char *)&d,(ulong)pcVar8);
                    if (lVar10 == 0) {
                      strlen(pcVar8);
                      std::__cxx11::string::substr((ulong)&suffix,(ulong)&d);
                      std::__cxx11::string::assign((char *)&d);
                      std::__cxx11::string::append((char *)&d);
                      std::__cxx11::string::append((string *)&d);
                      cmsys::SystemTools::ConvertToUnixSlashes(&d);
                      goto LAB_0034b04f;
                    }
                  }
                }
                else {
                  lVar10 = std::__cxx11::string::find((string *)&d,(ulong)&rootPath);
                  if (lVar10 != 0) goto LAB_0034af9f;
                  std::__cxx11::string::substr((ulong)&suffix,(ulong)&d);
                  std::__cxx11::string::operator=((string *)&d,(string *)&suffix);
LAB_0034b04f:
                  std::__cxx11::string::~string((string *)&suffix);
                }
                pVar16 = std::
                         _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         ::_M_insert_unique<std::__cxx11::string_const&>
                                   ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                     *)&emitted,&d);
                if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(local_110,&d);
                }
                goto LAB_0034af12;
              }
              std::__cxx11::string::~string((string *)&local_70);
            }
            std::__cxx11::string::~string((string *)&suffix);
          }
          goto LAB_0034af12;
        }
      }
      else {
        std::__cxx11::string::string((string *)&d,(string *)pbVar15);
        if (rootPath._M_string_length == 0) {
LAB_0034ad83:
          if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
            lVar10 = std::__cxx11::string::find((char *)&d,(ulong)pcVar8);
            if (lVar10 == 0) {
              strlen(pcVar8);
              std::__cxx11::string::substr((ulong)&suffix,(ulong)&d);
              std::__cxx11::string::assign((char *)&d);
              std::__cxx11::string::append((char *)&d);
              std::__cxx11::string::append((string *)&d);
              cmsys::SystemTools::ConvertToUnixSlashes(&d);
              goto LAB_0034aeeb;
            }
          }
        }
        else {
          lVar10 = std::__cxx11::string::find((string *)&d,(ulong)&rootPath);
          if (lVar10 != 0) goto LAB_0034ad83;
          std::__cxx11::string::substr((ulong)&suffix,(ulong)&d);
          std::__cxx11::string::operator=((string *)&d,(string *)&suffix);
LAB_0034aeeb:
          std::__cxx11::string::~string((string *)&suffix);
        }
        pVar16 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&emitted,&d);
        if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_110,&d);
        }
LAB_0034af12:
        std::__cxx11::string::~string((string *)&d);
      }
LAB_0034af1a:
    }
    std::__cxx11::string::~string((string *)&rootPath);
  }
  pLVar13 = cmTarget::GetLinkClosure(this->Target,&this->Config);
  for (pbVar15 = (pLVar13->Languages).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar15 !=
      (pLVar13->Languages).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar15 = pbVar15 + 1) {
    std::operator+(&d,"CMAKE_",pbVar15);
    std::operator+(&rootPath,&d,"_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH");
    std::__cxx11::string::~string((string *)&d);
    bVar4 = cmMakefile::IsOn(this->Makefile,&rootPath);
    if (bVar4) {
      std::operator+(&suffix,"CMAKE_",pbVar15);
      std::operator+(&d,&suffix,"_IMPLICIT_LINK_DIRECTORIES");
      std::__cxx11::string::~string((string *)&suffix);
      pcVar8 = cmMakefile::GetDefinition(this->Makefile,&d);
      if (pcVar8 != (char *)0x0) {
        cmCLI_ExpandListUnique(pcVar8,local_110,&emitted);
      }
      std::__cxx11::string::~string((string *)&d);
    }
    std::__cxx11::string::~string((string *)&rootPath);
  }
  cmCLI_ExpandListUnique((this->RuntimeAlways)._M_dataplus._M_p,local_110,&emitted);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&emitted._M_t);
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install)
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH() &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath =
    outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Construct the RPATH.
  std::set<std::string> emitted;
  if(use_install_rpath)
    {
    const char* install_rpath = this->Target->GetProperty("INSTALL_RPATH");
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
    }
  if(use_build_rpath || use_link_rpath)
    {
    std::string rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    const char *stagePath
                  = this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    const char *installPrefix
                  = this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    for(std::vector<std::string>::const_iterator ri = rdirs.begin();
        ri != rdirs.end(); ++ri)
      {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if(use_build_rpath)
        {
        std::string d = *ri;
        if (!rootPath.empty() && d.find(rootPath) == 0)
          {
          d = d.substr(rootPath.size());
          }
        else if (stagePath && *stagePath && d.find(stagePath) == 0)
          {
          std::string suffix = d.substr(strlen(stagePath));
          d = installPrefix;
          d += "/";
          d += suffix;
          cmSystemTools::ConvertToUnixSlashes(d);
          }
        if(emitted.insert(d).second)
          {
          runtimeDirs.push_back(d);
          }
        }
      else if(use_link_rpath)
        {
        // Do not add any path inside the source or build tree.
        const char* topSourceDir = this->Makefile->GetHomeDirectory();
        const char* topBinaryDir = this->Makefile->GetHomeOutputDirectory();
        if(!cmSystemTools::ComparePath(*ri, topSourceDir) &&
           !cmSystemTools::ComparePath(*ri, topBinaryDir) &&
           !cmSystemTools::IsSubDirectory(*ri, topSourceDir) &&
           !cmSystemTools::IsSubDirectory(*ri, topBinaryDir))
          {
          std::string d = *ri;
          if (!rootPath.empty() && d.find(rootPath) == 0)
            {
            d = d.substr(rootPath.size());
            }
          else if (stagePath && *stagePath && d.find(stagePath) == 0)
            {
            std::string suffix = d.substr(strlen(stagePath));
            d = installPrefix;
            d += "/";
            d += suffix;
            cmSystemTools::ConvertToUnixSlashes(d);
            }
          if(emitted.insert(d).second)
            {
            runtimeDirs.push_back(d);
            }
          }
        }
      }
    }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
  cmTarget::LinkClosure const* lc =
    this->Target->GetLinkClosure(this->Config);
  for(std::vector<std::string>::const_iterator li = lc->Languages.begin();
      li != lc->Languages.end(); ++li)
    {
    std::string useVar = "CMAKE_" + *li +
      "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH";
    if(this->Makefile->IsOn(useVar))
      {
      std::string dirVar = "CMAKE_" + *li +
        "_IMPLICIT_LINK_DIRECTORIES";
      if(const char* dirs = this->Makefile->GetDefinition(dirVar))
        {
        cmCLI_ExpandListUnique(dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways.c_str(), runtimeDirs, emitted);
}